

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

void duckdb::Prefix::TransformToDeprecated
               (ART *art,Node *node,unsafe_unique_ptr<FixedSizeAllocator> *allocator)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> this;
  IndexPointer IVar1;
  Node NVar2;
  idx_t i;
  ulong uVar3;
  Prefix new_prefix;
  Node current_node;
  Prefix prefix_1;
  Prefix local_48;
  
  this._M_head_impl =
       (allocator->
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  if (this._M_head_impl == (FixedSizeAllocator *)0x0) {
    do {
      NVar2.super_IndexPointer.data = (IndexPointer)(node->super_IndexPointer).data;
      if (((ulong)NVar2.super_IndexPointer.data & 0xff00000000000000) != 0x100000000000000)
      goto LAB_01a1cd96;
      Prefix(&new_prefix,art,NVar2,true,true);
      node = new_prefix.ptr;
    } while (new_prefix.in_memory == true);
  }
  else {
    IVar1 = FixedSizeAllocator::New(this._M_head_impl);
    NVar2.super_IndexPointer.data =
         (IndexPointer)(IVar1.data & 0xffffffffffffff | 0x100000000000000);
    Prefix(&new_prefix,allocator,NVar2,0xf);
    current_node.super_IndexPointer.data = (IndexPointer)(node->super_IndexPointer).data;
    while (((ulong)current_node.super_IndexPointer.data & 0xff00000000000000) == 0x100000000000000)
    {
      Prefix(&prefix_1,art,current_node,true,true);
      if (prefix_1.in_memory != true) {
        return;
      }
      for (uVar3 = 0; uVar3 < prefix_1.data[art->prefix_count]; uVar3 = uVar3 + 1) {
        TransformToDeprecatedAppend(&local_48,&new_prefix,art,allocator,prefix_1.data[uVar3]);
        new_prefix.ptr = local_48.ptr;
      }
      ((new_prefix.ptr)->super_IndexPointer).data = ((prefix_1.ptr)->super_IndexPointer).data;
      ((prefix_1.ptr)->super_IndexPointer).data = 0;
      Node::Free(art,&current_node);
      current_node.super_IndexPointer.data =
           (IndexPointer)((new_prefix.ptr)->super_IndexPointer).data;
    }
    (node->super_IndexPointer).data = (idx_t)NVar2;
    node = new_prefix.ptr;
LAB_01a1cd96:
    Node::TransformToDeprecated(art,node,allocator);
  }
  return;
}

Assistant:

void Prefix::TransformToDeprecated(ART &art, Node &node, unsafe_unique_ptr<FixedSizeAllocator> &allocator) {
	// Early-out, if we do not need any transformations.
	if (!allocator) {
		reference<Node> ref(node);
		while (ref.get().GetType() == PREFIX && ref.get().GetGateStatus() == GateStatus::GATE_NOT_SET) {
			Prefix prefix(art, ref, true, true);
			if (!prefix.in_memory) {
				return;
			}
			ref = *prefix.ptr;
		}
		return Node::TransformToDeprecated(art, ref, allocator);
	}

	// We need to create a new prefix (chain).
	Node new_node;
	new_node = allocator->New();
	new_node.SetMetadata(static_cast<uint8_t>(PREFIX));
	Prefix new_prefix(allocator, new_node, DEPRECATED_COUNT);

	Node current_node = node;
	while (current_node.GetType() == PREFIX && current_node.GetGateStatus() == GateStatus::GATE_NOT_SET) {
		Prefix prefix(art, current_node, true, true);
		if (!prefix.in_memory) {
			return;
		}

		for (idx_t i = 0; i < prefix.data[Count(art)]; i++) {
			new_prefix = new_prefix.TransformToDeprecatedAppend(art, allocator, prefix.data[i]);
		}

		*new_prefix.ptr = *prefix.ptr;
		prefix.ptr->Clear();
		Node::Free(art, current_node);
		current_node = *new_prefix.ptr;
	}

	node = new_node;
	return Node::TransformToDeprecated(art, *new_prefix.ptr, allocator);
}